

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

char * Ptr_AbcObjName(Abc_Obj_t *pObj)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  
  while( true ) {
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar2 == 6) || ((*(uint *)&pObj->field_0x14 & 0xe) == 8)) || (uVar2 == 10)) {
      pcVar1 = Abc_ObjName(pObj);
      return pcVar1;
    }
    if (((7 < uVar2) || (lVar3 = 0x30, (0xa4U >> uVar2 & 1) == 0)) &&
       (lVar3 = 0x20, uVar2 - 5 < 0xfffffffe)) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[**(int **)((long)&pObj->pNtk + lVar3)];
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x66,"char *Ptr_AbcObjName(Abc_Obj_t *)");
}

Assistant:

char * Ptr_AbcObjName( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsBox(pObj) )
        return Abc_ObjName(pObj);
    if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanout0(pObj));
    if ( Abc_ObjIsCo(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanin0(pObj));
    assert( 0 );
    return NULL;
}